

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

FindInfo __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_THash,_TEq,_phmap::priv::Alloc<long>_>::
find_first_non_full(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_THash,_TEq,_phmap::priv::Alloc<long>_>
                    *this,size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  ulong uVar20;
  ulong in_RDX;
  ulong uVar21;
  long lVar22;
  undefined1 in_XMM1_Ba;
  char cVar23;
  undefined1 in_XMM1_Bb;
  char cVar24;
  undefined1 in_XMM1_Bc;
  char cVar25;
  undefined1 in_XMM1_Bd;
  char cVar26;
  undefined1 in_XMM1_Be;
  char cVar27;
  undefined1 in_XMM1_Bf;
  char cVar28;
  undefined1 in_XMM1_Bg;
  char cVar29;
  undefined1 in_XMM1_Bh;
  char cVar30;
  undefined1 in_XMM1_Bi;
  char cVar31;
  undefined1 in_XMM1_Bj;
  char cVar32;
  undefined1 in_XMM1_Bk;
  char cVar33;
  undefined1 in_XMM1_Bl;
  char cVar34;
  undefined1 in_XMM1_Bm;
  char cVar35;
  undefined1 in_XMM1_Bn;
  char cVar36;
  undefined1 in_XMM1_Bo;
  char cVar37;
  undefined1 in_XMM1_Bp;
  byte bVar38;
  FindInfo FVar39;
  
  if ((hashval + 1 & hashval) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar21 = (in_RDX >> 7 ^ (ulong)this >> 0xc) & hashval;
  pcVar1 = (char *)((long)&this->ctrl_ + uVar21);
  iVar8 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                 CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
  iVar9 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                 CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
  iVar10 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                  CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
  iVar11 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                  CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
  cVar23 = -(*pcVar1 < (char)iVar8);
  cVar24 = -(pcVar1[1] < (char)((uint)iVar8 >> 8));
  cVar25 = -(pcVar1[2] < (char)((uint)iVar8 >> 0x10));
  cVar26 = -(pcVar1[3] < (char)((uint)iVar8 >> 0x18));
  cVar27 = -(pcVar1[4] < (char)iVar9);
  cVar28 = -(pcVar1[5] < (char)((uint)iVar9 >> 8));
  cVar29 = -(pcVar1[6] < (char)((uint)iVar9 >> 0x10));
  cVar30 = -(pcVar1[7] < (char)((uint)iVar9 >> 0x18));
  cVar31 = -(pcVar1[8] < (char)iVar10);
  cVar32 = -(pcVar1[9] < (char)((uint)iVar10 >> 8));
  cVar33 = -(pcVar1[10] < (char)((uint)iVar10 >> 0x10));
  cVar34 = -(pcVar1[0xb] < (char)((uint)iVar10 >> 0x18));
  cVar35 = -(pcVar1[0xc] < (char)iVar11);
  cVar36 = -(pcVar1[0xd] < (char)((uint)iVar11 >> 8));
  cVar37 = -(pcVar1[0xe] < (char)((uint)iVar11 >> 0x10));
  bVar38 = -(pcVar1[0xf] < (char)((uint)iVar11 >> 0x18));
  auVar4[1] = cVar24;
  auVar4[0] = cVar23;
  auVar4[2] = cVar25;
  auVar4[3] = cVar26;
  auVar4[4] = cVar27;
  auVar4[5] = cVar28;
  auVar4[6] = cVar29;
  auVar4[7] = cVar30;
  auVar4[8] = cVar31;
  auVar4[9] = cVar32;
  auVar4[10] = cVar33;
  auVar4[0xb] = cVar34;
  auVar4[0xc] = cVar35;
  auVar4[0xd] = cVar36;
  auVar4[0xe] = cVar37;
  auVar4[0xf] = bVar38;
  auVar5[1] = cVar24;
  auVar5[0] = cVar23;
  auVar5[2] = cVar25;
  auVar5[3] = cVar26;
  auVar5[4] = cVar27;
  auVar5[5] = cVar28;
  auVar5[6] = cVar29;
  auVar5[7] = cVar30;
  auVar5[8] = cVar31;
  auVar5[9] = cVar32;
  auVar5[10] = cVar33;
  auVar5[0xb] = cVar34;
  auVar5[0xc] = cVar35;
  auVar5[0xd] = cVar36;
  auVar5[0xe] = cVar37;
  auVar5[0xf] = bVar38;
  auVar18[1] = cVar26;
  auVar18[0] = cVar25;
  auVar18[2] = cVar27;
  auVar18[3] = cVar28;
  auVar18[4] = cVar29;
  auVar18[5] = cVar30;
  auVar18[6] = cVar31;
  auVar18[7] = cVar32;
  auVar18[8] = cVar33;
  auVar18[9] = cVar34;
  auVar18[10] = cVar35;
  auVar18[0xb] = cVar36;
  auVar18[0xc] = cVar37;
  auVar18[0xd] = bVar38;
  auVar16[1] = cVar27;
  auVar16[0] = cVar26;
  auVar16[2] = cVar28;
  auVar16[3] = cVar29;
  auVar16[4] = cVar30;
  auVar16[5] = cVar31;
  auVar16[6] = cVar32;
  auVar16[7] = cVar33;
  auVar16[8] = cVar34;
  auVar16[9] = cVar35;
  auVar16[10] = cVar36;
  auVar16[0xb] = cVar37;
  auVar16[0xc] = bVar38;
  auVar14[1] = cVar28;
  auVar14[0] = cVar27;
  auVar14[2] = cVar29;
  auVar14[3] = cVar30;
  auVar14[4] = cVar31;
  auVar14[5] = cVar32;
  auVar14[6] = cVar33;
  auVar14[7] = cVar34;
  auVar14[8] = cVar35;
  auVar14[9] = cVar36;
  auVar14[10] = cVar37;
  auVar14[0xb] = bVar38;
  auVar12[1] = cVar29;
  auVar12[0] = cVar28;
  auVar12[2] = cVar30;
  auVar12[3] = cVar31;
  auVar12[4] = cVar32;
  auVar12[5] = cVar33;
  auVar12[6] = cVar34;
  auVar12[7] = cVar35;
  auVar12[8] = cVar36;
  auVar12[9] = cVar37;
  auVar12[10] = bVar38;
  uVar3 = (ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar16 >> 7,0) & 1) << 3 |
          (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 | (ushort)(SUB111(auVar12 >> 7,0) & 1) << 5 |
          (ushort)((byte)(CONCAT19(bVar38,CONCAT18(cVar37,CONCAT17(cVar36,CONCAT16(cVar35,CONCAT15(
                                                  cVar34,CONCAT14(cVar33,CONCAT13(cVar32,CONCAT12(
                                                  cVar31,CONCAT11(cVar30,cVar29))))))))) >> 7) & 1)
          << 6 | (ushort)((byte)(CONCAT18(bVar38,CONCAT17(cVar37,CONCAT16(cVar36,CONCAT15(cVar35,
                                                  CONCAT14(cVar34,CONCAT13(cVar33,CONCAT12(cVar32,
                                                  CONCAT11(cVar31,cVar30)))))))) >> 7) & 1) << 7 |
          (ushort)(bVar38 >> 7) << 0xf;
  if (uVar3 == 0) {
    uVar20 = 0;
    do {
      if (hashval <= uVar20) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x89c,
                      "FindInfo phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, THash, TEq, phmap::priv::Alloc<long>>::find_first_non_full(size_t) [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = THash, Eq = TEq, Alloc = phmap::priv::Alloc<long>]"
                     );
      }
      lVar22 = uVar21 + uVar20;
      uVar20 = uVar20 + 0x10;
      uVar21 = lVar22 + 0x10U & hashval;
      pcVar1 = (char *)((long)&this->ctrl_ + uVar21);
      iVar8 = -(uint)(CONCAT13(cVar26,CONCAT12(cVar25,CONCAT11(cVar24,cVar23))) ==
                     CONCAT13(cVar26,CONCAT12(cVar25,CONCAT11(cVar24,cVar23))));
      iVar9 = -(uint)(CONCAT13(cVar30,CONCAT12(cVar29,CONCAT11(cVar28,cVar27))) ==
                     CONCAT13(cVar30,CONCAT12(cVar29,CONCAT11(cVar28,cVar27))));
      iVar10 = -(uint)(CONCAT13(cVar34,CONCAT12(cVar33,CONCAT11(cVar32,cVar31))) ==
                      CONCAT13(cVar34,CONCAT12(cVar33,CONCAT11(cVar32,cVar31))));
      iVar11 = -(uint)(CONCAT13(bVar38,CONCAT12(cVar37,CONCAT11(cVar36,cVar35))) ==
                      CONCAT13(bVar38,CONCAT12(cVar37,CONCAT11(cVar36,cVar35))));
      cVar23 = -(*pcVar1 < (char)iVar8);
      cVar24 = -(pcVar1[1] < (char)((uint)iVar8 >> 8));
      cVar25 = -(pcVar1[2] < (char)((uint)iVar8 >> 0x10));
      cVar26 = -(pcVar1[3] < (char)((uint)iVar8 >> 0x18));
      cVar27 = -(pcVar1[4] < (char)iVar9);
      cVar28 = -(pcVar1[5] < (char)((uint)iVar9 >> 8));
      cVar29 = -(pcVar1[6] < (char)((uint)iVar9 >> 0x10));
      cVar30 = -(pcVar1[7] < (char)((uint)iVar9 >> 0x18));
      cVar31 = -(pcVar1[8] < (char)iVar10);
      cVar32 = -(pcVar1[9] < (char)((uint)iVar10 >> 8));
      cVar33 = -(pcVar1[10] < (char)((uint)iVar10 >> 0x10));
      cVar34 = -(pcVar1[0xb] < (char)((uint)iVar10 >> 0x18));
      cVar35 = -(pcVar1[0xc] < (char)iVar11);
      cVar36 = -(pcVar1[0xd] < (char)((uint)iVar11 >> 8));
      cVar37 = -(pcVar1[0xe] < (char)((uint)iVar11 >> 0x10));
      bVar38 = -(pcVar1[0xf] < (char)((uint)iVar11 >> 0x18));
      auVar6[1] = cVar24;
      auVar6[0] = cVar23;
      auVar6[2] = cVar25;
      auVar6[3] = cVar26;
      auVar6[4] = cVar27;
      auVar6[5] = cVar28;
      auVar6[6] = cVar29;
      auVar6[7] = cVar30;
      auVar6[8] = cVar31;
      auVar6[9] = cVar32;
      auVar6[10] = cVar33;
      auVar6[0xb] = cVar34;
      auVar6[0xc] = cVar35;
      auVar6[0xd] = cVar36;
      auVar6[0xe] = cVar37;
      auVar6[0xf] = bVar38;
      auVar7[1] = cVar24;
      auVar7[0] = cVar23;
      auVar7[2] = cVar25;
      auVar7[3] = cVar26;
      auVar7[4] = cVar27;
      auVar7[5] = cVar28;
      auVar7[6] = cVar29;
      auVar7[7] = cVar30;
      auVar7[8] = cVar31;
      auVar7[9] = cVar32;
      auVar7[10] = cVar33;
      auVar7[0xb] = cVar34;
      auVar7[0xc] = cVar35;
      auVar7[0xd] = cVar36;
      auVar7[0xe] = cVar37;
      auVar7[0xf] = bVar38;
      auVar19[1] = cVar26;
      auVar19[0] = cVar25;
      auVar19[2] = cVar27;
      auVar19[3] = cVar28;
      auVar19[4] = cVar29;
      auVar19[5] = cVar30;
      auVar19[6] = cVar31;
      auVar19[7] = cVar32;
      auVar19[8] = cVar33;
      auVar19[9] = cVar34;
      auVar19[10] = cVar35;
      auVar19[0xb] = cVar36;
      auVar19[0xc] = cVar37;
      auVar19[0xd] = bVar38;
      auVar17[1] = cVar27;
      auVar17[0] = cVar26;
      auVar17[2] = cVar28;
      auVar17[3] = cVar29;
      auVar17[4] = cVar30;
      auVar17[5] = cVar31;
      auVar17[6] = cVar32;
      auVar17[7] = cVar33;
      auVar17[8] = cVar34;
      auVar17[9] = cVar35;
      auVar17[10] = cVar36;
      auVar17[0xb] = cVar37;
      auVar17[0xc] = bVar38;
      auVar15[1] = cVar28;
      auVar15[0] = cVar27;
      auVar15[2] = cVar29;
      auVar15[3] = cVar30;
      auVar15[4] = cVar31;
      auVar15[5] = cVar32;
      auVar15[6] = cVar33;
      auVar15[7] = cVar34;
      auVar15[8] = cVar35;
      auVar15[9] = cVar36;
      auVar15[10] = cVar37;
      auVar15[0xb] = bVar38;
      auVar13[1] = cVar29;
      auVar13[0] = cVar28;
      auVar13[2] = cVar30;
      auVar13[3] = cVar31;
      auVar13[4] = cVar32;
      auVar13[5] = cVar33;
      auVar13[6] = cVar34;
      auVar13[7] = cVar35;
      auVar13[8] = cVar36;
      auVar13[9] = cVar37;
      auVar13[10] = bVar38;
      uVar3 = (ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB141(auVar19 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar17 >> 7,0) & 1) << 3
              | (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 |
              (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
              (ushort)((byte)(CONCAT19(bVar38,CONCAT18(cVar37,CONCAT17(cVar36,CONCAT16(cVar35,
                                                  CONCAT15(cVar34,CONCAT14(cVar33,CONCAT13(cVar32,
                                                  CONCAT12(cVar31,CONCAT11(cVar30,cVar29))))))))) >>
                             7) & 1) << 6 |
              (ushort)((byte)(CONCAT18(bVar38,CONCAT17(cVar37,CONCAT16(cVar36,CONCAT15(cVar35,
                                                  CONCAT14(cVar34,CONCAT13(cVar33,CONCAT12(cVar32,
                                                  CONCAT11(cVar31,cVar30)))))))) >> 7) & 1) << 7 |
              (ushort)(bVar38 >> 7) << 0xf;
    } while (uVar3 == 0);
  }
  uVar2 = 0;
  if (uVar3 != 0) {
    for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
    }
  }
  FVar39.offset = uVar2 + uVar21 & hashval;
  FVar39.probe_length = uVar21;
  return FVar39;
}

Assistant:

FindInfo find_first_non_full(size_t hashval) {
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            auto mask = g.MatchEmptyOrDeleted();
            if (mask) {
                return {seq.offset((size_t)mask.LowestBitSet()), seq.getindex()};
            }
            assert(seq.getindex() < capacity_ && "full table!");
            seq.next();
        }
    }